

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

int IPdr_ManRestoreClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses,Vec_Int_t *vMap)

{
  uint uVar1;
  Vec_Vec_t *__ptr;
  void *pvVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if (vClauses == (Vec_Vec_t *)0x0) {
    __assert_fail("vClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x156,"int IPdr_ManRestoreClauses(Pdr_Man_t *, Vec_Vec_t *, Vec_Int_t *)");
  }
  __ptr = p->vClauses;
  iVar5 = __ptr->nSize;
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar8];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
        }
        free(pvVar2);
        iVar5 = __ptr->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  p->vClauses = vClauses;
  iVar5 = vClauses->nSize;
  if (vMap != (Vec_Int_t *)0x0) {
    if (iVar5 < 1) {
      return 0;
    }
    lVar8 = 0;
    do {
      if (iVar5 <= lVar8) {
LAB_008ff5eb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar2 = vClauses->pArray[lVar8];
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar3 = *(long *)((long)pvVar2 + 8);
        lVar9 = 0;
        do {
          lVar4 = *(long *)(lVar3 + lVar9 * 8);
          iVar7 = *(int *)(lVar4 + 0x10);
          if (0 < (long)iVar7) {
            uVar6 = 0;
            do {
              uVar1 = *(uint *)(lVar4 + 0x14 + uVar6 * 4);
              if ((int)uVar1 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x134,"int Abc_Lit2LitV(int *, int)");
              }
              if (vMap->pArray[uVar1 >> 1] < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              *(uint *)(lVar4 + 0x14 + uVar6 * 4) = (uVar1 & 1) + vMap->pArray[uVar1 >> 1] * 2;
              uVar6 = uVar6 + 1;
            } while (uVar6 < (ulong)(long)iVar7);
            iVar5 = vClauses->nSize;
          }
          if (iVar5 <= lVar8) goto LAB_008ff5eb;
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)pvVar2 + 4));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
  }
  if (0 < iVar5) {
    iVar7 = 0;
    do {
      IPdr_ManSetSolver(p,iVar7,(uint)(iVar7 < iVar5 + -1));
      iVar7 = iVar7 + 1;
      iVar5 = p->vClauses->nSize;
    } while (iVar7 < iVar5);
  }
  return 0;
}

Assistant:

int IPdr_ManRestoreClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses, Vec_Int_t * vMap )
{
    int i;

    assert(vClauses);

    Vec_VecFree(p->vClauses);
    p->vClauses = vClauses;

    // remap clause literals using mapping (old flop -> new flop) found in array vMap
    if ( vMap )
    {
        Pdr_Set_t * pSet; int j, k;   
        Vec_VecForEachEntry( Pdr_Set_t *, vClauses, pSet, i, j )
            for ( k = 0; k < pSet->nLits; k++ )
                pSet->Lits[k] = Abc_Lit2LitV( Vec_IntArray(vMap), pSet->Lits[k] );
    }

    for ( i = 0; i < Vec_VecSize(p->vClauses); ++i )
        IPdr_ManSetSolver( p, i, i < Vec_VecSize( p->vClauses ) - 1 );

    return 0;
}